

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O3

double Abc_NtkCountNodes_rec(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  void **__ptr;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *__ptr_00;
  uint uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  if (0.0 <= pNtk->dTemp) {
    return pNtk->dTemp;
  }
  __ptr_00 = Abc_NtkDfsBoxes(pNtk);
  iVar1 = __ptr_00->nSize;
  __ptr = __ptr_00->pArray;
  dVar6 = 0.0;
  if ((long)iVar1 < 1) {
    if (__ptr == (void **)0x0) goto LAB_0086787d;
  }
  else {
    lVar4 = 0;
    do {
      uVar2 = *(uint *)((long)__ptr[lVar4] + 0x14);
      uVar3 = uVar2 & 0xf;
      if (uVar3 == 7) {
        dVar6 = dVar6 + 1.0;
      }
      else if (((uVar2 & 0xe) == 8 || uVar3 == 10) &&
              (pNtk_00 = *(Abc_Ntk_t **)((long)__ptr[lVar4] + 0x38), pNtk_00 != pNtk)) {
        dVar5 = Abc_NtkCountNodes_rec(pNtk_00);
        dVar6 = dVar6 + dVar5;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  free(__ptr);
LAB_0086787d:
  free(__ptr_00);
  pNtk->dTemp = dVar6;
  return dVar6;
}

Assistant:

double Abc_NtkCountNodes_rec( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    double Counter = 0;
    int i;
    if ( pNtk->dTemp >= 0 )
        return pNtk->dTemp;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsNode(pObj) )
            Counter++;
        else if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Counter += Abc_NtkCountNodes_rec( (Abc_Ntk_t *)pObj->pData );
    Vec_PtrFree( vOrder );
    return pNtk->dTemp = Counter;
}